

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O2

Aig_Obj_t * Kit_GraphToAig(Aig_Man_t *pMan,Aig_Obj_t **pFanins,Kit_Graph_t *pGraph)

{
  long lVar1;
  Aig_Obj_t *pAVar2;
  int i;
  long lVar3;
  
  lVar1 = 1;
  for (lVar3 = 0; lVar3 < pGraph->nLeaves; lVar3 = lVar3 + 1) {
    *(Aig_Obj_t **)(&pGraph->pNodes->eEdge0 + lVar1 * 2) = pFanins[lVar3];
    lVar1 = lVar1 + 3;
  }
  pAVar2 = Kit_GraphToAigInternal(pMan,pGraph);
  return pAVar2;
}

Assistant:

Aig_Obj_t * Kit_GraphToAig( Aig_Man_t * pMan, Aig_Obj_t ** pFanins, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = pFanins[i];
    // perform strashing
    return Kit_GraphToAigInternal( pMan, pGraph );
}